

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O3

Dataset * __thiscall
notch::pre::OneHotEncoder::apply
          (Dataset *__return_storage_ptr__,OneHotEncoder *this,Dataset *dataIn)

{
  pointer pvVar1;
  pointer pvVar2;
  Array a;
  Dataset dOut;
  size_t local_78;
  void *local_70;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_68;
  Dataset *local_48;
  valarray<float> local_40;
  
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::reserve
            (&local_68,
             (long)(dataIn->
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(dataIn->
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar2 = (dataIn->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (dataIn->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 == pvVar1) {
    std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
              ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
               __return_storage_ptr__,
               (vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)dataIn);
  }
  else {
    local_48 = __return_storage_ptr__;
    do {
      local_78 = pvVar2->_M_size;
      local_70 = operator_new(local_78 << 2);
      if (pvVar2->_M_data != (float *)0x0) {
        memcpy(local_70,pvVar2->_M_data,local_78 << 2);
      }
      (*(this->super_ADatasetTransformer)._vptr_ADatasetTransformer[1])(&local_40,this,&local_78);
      std::vector<std::valarray<float>,std::allocator<std::valarray<float>>>::
      emplace_back<std::valarray<float>>
                ((vector<std::valarray<float>,std::allocator<std::valarray<float>>> *)&local_68,
                 &local_40);
      operator_delete(local_40._M_data);
      operator_delete(local_70);
      pvVar2 = pvVar2 + 1;
    } while (pvVar2 != pvVar1);
    (local_48->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (local_48->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (local_48->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__ = local_48;
  }
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

virtual Dataset apply(const Dataset &dataIn) {
        Dataset dOut;
        dOut.reserve(dataIn.size());
        if (dataIn.empty()) {
            return dataIn;
        }
        for (Array a : dataIn) {
            dOut.push_back(apply(a));
        }
        return dOut;
    }